

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O3

void __thiscall FPolyObj::CreateSubsectorLinks(FPolyObj *this)

{
  uint *puVar1;
  uint uVar2;
  side_t **ppsVar3;
  side_t *psVar4;
  line_t_conflict *plVar5;
  subsector_t *psVar6;
  FPolyNode *pFVar7;
  double dVar8;
  FPolyNode *pnode;
  side_t **ppsVar9;
  uint uVar10;
  uint amount;
  ulong uVar11;
  bool bVar12;
  float dummybbox [4];
  float local_38 [6];
  
  if (FreePolyNodes == (FPolyNode *)0x0) {
    pnode = (FPolyNode *)operator_new(0x40);
    (pnode->segs).Array = (FPolySeg *)0x0;
    (pnode->segs).Most = 0;
    (pnode->segs).Count = 0;
  }
  else {
    pnode = FreePolyNodes;
    FreePolyNodes = FreePolyNodes->pnext;
  }
  pnode->state = 0x539;
  pnode->pnext = (FPolyNode *)0x0;
  pnode->pprev = (FPolyNode *)0x0;
  pnode->subsector = (subsector_t *)0x0;
  pnode->snext = (FPolyNode *)0x0;
  local_38[0] = 0.0;
  local_38[1] = 0.0;
  local_38[2] = 0.0;
  local_38[3] = 0.0;
  pnode->poly = this;
  uVar2 = (this->Sidedefs).Count;
  puVar1 = &(pnode->segs).Count;
  amount = uVar2 - *puVar1;
  uVar10 = uVar2;
  if (*puVar1 <= uVar2 && amount != 0) {
    TArray<FPolySeg,_FPolySeg>::Grow(&pnode->segs,amount);
    uVar10 = (this->Sidedefs).Count;
  }
  (pnode->segs).Count = uVar2;
  if (uVar10 != 0) {
    ppsVar3 = (this->Sidedefs).Array;
    ppsVar9 = &((pnode->segs).Array)->wall;
    uVar11 = 0;
    do {
      psVar4 = ppsVar3[uVar11];
      plVar5 = psVar4->linedef;
      bVar12 = plVar5->sidedef[0] == psVar4;
      dVar8 = (*(double **)(plVar5->args + (ulong)!bVar12 * 2 + -0xb))[1];
      (((FPolySeg *)(ppsVar9 + -4))->v1).pos.X =
           **(double **)(plVar5->args + (ulong)!bVar12 * 2 + -0xb);
      ppsVar9[-3] = (side_t *)dVar8;
      dVar8 = (*(double **)(plVar5->args + (ulong)bVar12 * 2 + -0xb))[1];
      (((FPolyVertex *)(ppsVar9 + -2))->pos).X =
           **(double **)(plVar5->args + (ulong)bVar12 * 2 + -0xb);
      ppsVar9[-1] = (side_t *)dVar8;
      *ppsVar9 = psVar4;
      uVar11 = uVar11 + 1;
      ppsVar9 = ppsVar9 + 5;
    } while (uVar10 != uVar11);
  }
  if ((i_compatflags._3_1_ & 0x40) == 0) {
    SplitPoly(pnode,nodes + (long)numnodes + -1,local_38);
  }
  else {
    psVar6 = this->CenterSubsector;
    pFVar7 = psVar6->polys;
    pnode->pnext = pFVar7;
    if (pFVar7 != (FPolyNode *)0x0) {
      if (pFVar7->state != 0x539) {
        __assert_fail("node->pnext->state == 1337",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/po_man.cpp"
                      ,0x869,"void FPolyObj::CreateSubsectorLinks()");
      }
      pFVar7->pprev = pnode;
    }
    pnode->pprev = (FPolyNode *)0x0;
    psVar6->polys = pnode;
    pnode->snext = pnode->poly->subsectorlinks;
    pnode->poly->subsectorlinks = pnode;
    pnode->subsector = psVar6;
  }
  return;
}

Assistant:

void FPolyObj::CreateSubsectorLinks()
{
	FPolyNode *node = NewPolyNode();
	// Even though we don't care about it, we need to initialize this
	// bounding box to something so that Valgrind won't complain about it
	// when SplitPoly modifies it.
	float dummybbox[4] = { 0 };

	node->poly = this;
	node->segs.Resize(Sidedefs.Size());

	for(unsigned i=0; i<Sidedefs.Size(); i++)
	{
		FPolySeg *seg = &node->segs[i];
		side_t *side = Sidedefs[i];

		seg->v1 = side->V1();
		seg->v2 = side->V2();
		seg->wall = side;
	}
	if (!(i_compatflags & COMPATF_POLYOBJ))
	{
		SplitPoly(node, nodes + numnodes - 1, dummybbox);
	}
	else
	{
		subsector_t *sub = CenterSubsector;

		// Link node to subsector
		node->pnext = sub->polys;
		if (node->pnext != NULL) 
		{
			assert(node->pnext->state == 1337);
			node->pnext->pprev = node;
		}
		node->pprev = NULL;
		sub->polys = node;

		// link node to polyobject
		node->snext = node->poly->subsectorlinks;
		node->poly->subsectorlinks = node;
		node->subsector = sub;
	}
}